

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O1

ssize_t __thiscall
libchars::terminal_driver::write(terminal_driver *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  void *__buf_00;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar4 = (void *)((long)__buf + (long)__buf_00);
  do {
    if (pvVar4 <= __buf_00) {
      return 0;
    }
    sVar2 = ::write(this->fd_w,__buf_00,(long)pvVar4 - (long)__buf_00);
    if (sVar2 < 1) {
      if (sVar2 != 0) {
        piVar3 = __errno_location();
        if ((*piVar3 == 0xb) || (*piVar3 == 4)) goto LAB_00113379;
      }
      bVar1 = false;
    }
    else {
      __buf_00 = (void *)((long)__buf_00 + sVar2);
LAB_00113379:
      bVar1 = true;
    }
    if (!bVar1) {
      return 0xffffffff;
    }
  } while( true );
}

Assistant:

int terminal_driver::write(const char *sequence, size_t seqlen)
    {
        const char *const seqend = sequence + seqlen;

        while (sequence < seqend) {
            ssize_t n = ::write(fd_w, sequence, (size_t)(seqend - sequence));
            if (n > 0) {
                sequence += n;
            }
            else {
                if (n == 0)
                    return -1;
                if (errno != EINTR && errno != EWOULDBLOCK)
                    return -1;
            }
        }
        return 0;
    }